

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

Value * __thiscall HawkTracer::parser::Event::Value::operator=(Value *this,Value *other)

{
  EventKlassField *pEVar1;
  FieldType FVar2;
  
  pEVar1 = this->field;
  this->field = other->field;
  other->field = pEVar1;
  FVar2 = this->value;
  this->value = other->value;
  other->value = FVar2;
  return this;
}

Assistant:

Event::Value& Event::Value::operator=(Value other)
{
    _swap(other);
    return *this;
}